

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O3

_Bool testxor16pack(size_t size)

{
  _Bool _Var1;
  xor8_t filter;
  
  puts("testing xor16 pack/unpack");
  _Var1 = test(size,0,&filter,xor16_allocate_gen,xor16_free_gen,xor16_size_in_bytes_gen,
               xor16_pack_bytes_gen,xor16_pack_gen,xor16_unpack_gen,xor16_populate_gen,
               xor16_contain_gen);
  return _Var1;
}

Assistant:

bool testxor16pack(size_t size) {
  printf("testing xor16 pack/unpack\n");
  xor8_t filter;
  return test(size, 0, &filter,
              xor16_allocate_gen,
              xor16_free_gen,
              xor16_size_in_bytes_gen,
              xor16_pack_bytes_gen,
              xor16_pack_gen,
              xor16_unpack_gen,
              xor16_populate_gen,
              xor16_contain_gen);
}